

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

int * Eigen::internal::conditional_aligned_new_auto<int,true>(size_t size)

{
  ulong in_RDI;
  int *result;
  undefined8 local_10;
  
  if (in_RDI == 0) {
    local_10 = (int *)0x0;
  }
  else {
    if (0x3fffffffffffffff < in_RDI) {
      throw_std_bad_alloc();
    }
    local_10 = (int *)conditional_aligned_malloc<true>(0x2d29ba);
  }
  return local_10;
}

Assistant:

inline T* conditional_aligned_new_auto(size_t size)
{
  if(size==0)
    return 0; // short-cut. Also fixes Bug 884
  check_size_for_overflow<T>(size);
  T *result = reinterpret_cast<T*>(conditional_aligned_malloc<Align>(sizeof(T)*size));
  if(NumTraits<T>::RequireInitialization)
    construct_elements_of_array(result, size);
  return result;
}